

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int add_value(archive_read *a,huffman_code *code,int value,int codebits,int length)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  undefined4 in_EDX;
  long *in_RSI;
  archive *in_RDI;
  int in_R8D;
  int nextnode;
  int repeatnode;
  int bit;
  int bitpos;
  int lastnode;
  int repeatpos;
  huffman_code *in_stack_ffffffffffffffb8;
  int local_30;
  int local_2c;
  int local_4;
  
  free((void *)in_RSI[3]);
  in_RSI[3] = 0;
  if ((int)in_RSI[2] < in_R8D) {
    *(int *)(in_RSI + 2) = in_R8D;
  }
  if (in_R8D < *(int *)((long)in_RSI + 0xc)) {
    *(int *)((long)in_RSI + 0xc) = in_R8D;
  }
  local_2c = 0;
  local_30 = in_R8D + -1;
  do {
    if (local_30 < 0) {
      if ((*(int *)(*in_RSI + (long)local_2c * 8) == -1) &&
         (*(int *)(*in_RSI + 4 + (long)local_2c * 8) == -2)) {
        *(undefined4 *)(*in_RSI + (long)local_2c * 8) = in_EDX;
        *(undefined4 *)(*in_RSI + 4 + (long)local_2c * 8) = in_EDX;
        local_4 = 0;
      }
      else {
        archive_set_error(in_RDI,0x54,"Prefix found");
        local_4 = -0x1e;
      }
      return local_4;
    }
    uVar2 = in_ECX >> ((byte)local_30 & 0x1f) & 1;
    if (*(int *)(*in_RSI + (long)local_2c * 8) == *(int *)(*in_RSI + 4 + (long)local_2c * 8)) {
      archive_set_error(in_RDI,0x54,"Prefix found");
      return -0x1e;
    }
    if (local_30 == -1) {
      if (-1 < *(int *)(*in_RSI + (long)local_2c * 8 + (long)(int)uVar2 * 4)) {
        archive_set_error(in_RDI,0x54,"Invalid repeating code");
        return -0x1e;
      }
      iVar3 = new_node(in_stack_ffffffffffffffb8);
      if (iVar3 < 0) {
        archive_set_error(in_RDI,0xc,"Unable to allocate memory for node data.");
        return -0x1e;
      }
      iVar4 = new_node(in_stack_ffffffffffffffb8);
      if (iVar4 < 0) {
        archive_set_error(in_RDI,0xc,"Unable to allocate memory for node data.");
        return -0x1e;
      }
      *(int *)(*in_RSI + (long)local_2c * 8 + (long)(int)uVar2 * 4) = iVar3;
      *(int *)(*in_RSI + (long)iVar3 * 8 + (long)(int)uVar2 * 4) = iVar3;
      *(int *)(*in_RSI + (long)iVar3 * 8 + (long)(int)(uVar2 ^ 1) * 4) = iVar4;
      local_30 = 0;
      local_2c = iVar4;
    }
    else {
      if (*(int *)(*in_RSI + (long)local_2c * 8 + (long)(int)uVar2 * 4) < 0) {
        iVar3 = new_node(in_stack_ffffffffffffffb8);
        if (iVar3 < 0) {
          archive_set_error(in_RDI,0xc,"Unable to allocate memory for node data.");
          return -0x1e;
        }
        lVar1 = in_RSI[1];
        *(int *)(in_RSI + 1) = (int)lVar1 + 1;
        *(int *)(*in_RSI + (long)local_2c * 8 + (long)(int)uVar2 * 4) = (int)lVar1;
      }
      local_2c = *(int *)(*in_RSI + (long)local_2c * 8 + (long)(int)uVar2 * 4);
    }
    local_30 = local_30 + -1;
  } while( true );
}

Assistant:

static int
add_value(struct archive_read *a, struct huffman_code *code, int value,
          int codebits, int length)
{
  int repeatpos, lastnode, bitpos, bit, repeatnode, nextnode;

  free(code->table);
  code->table = NULL;

  if(length > code->maxlength)
    code->maxlength = length;
  if(length < code->minlength)
    code->minlength = length;

  repeatpos = -1;
  if (repeatpos == 0 || (repeatpos >= 0
    && (((codebits >> (repeatpos - 1)) & 3) == 0
    || ((codebits >> (repeatpos - 1)) & 3) == 3)))
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid repeat position");
    return (ARCHIVE_FATAL);
  }

  lastnode = 0;
  for (bitpos = length - 1; bitpos >= 0; bitpos--)
  {
    bit = (codebits >> bitpos) & 1;

    /* Leaf node check */
    if (code->tree[lastnode].branches[0] ==
      code->tree[lastnode].branches[1])
    {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Prefix found");
      return (ARCHIVE_FATAL);
    }

    if (bitpos == repeatpos)
    {
      /* Open branch check */
      if (!(code->tree[lastnode].branches[bit] < 0))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid repeating code");
        return (ARCHIVE_FATAL);
      }

      if ((repeatnode = new_node(code)) < 0) {
        archive_set_error(&a->archive, ENOMEM,
                          "Unable to allocate memory for node data.");
        return (ARCHIVE_FATAL);
      }
      if ((nextnode = new_node(code)) < 0) {
        archive_set_error(&a->archive, ENOMEM,
                          "Unable to allocate memory for node data.");
        return (ARCHIVE_FATAL);
      }

      /* Set branches */
      code->tree[lastnode].branches[bit] = repeatnode;
      code->tree[repeatnode].branches[bit] = repeatnode;
      code->tree[repeatnode].branches[bit^1] = nextnode;
      lastnode = nextnode;

      bitpos++; /* terminating bit already handled, skip it */
    }
    else
    {
      /* Open branch check */
      if (code->tree[lastnode].branches[bit] < 0)
      {
        if (new_node(code) < 0) {
          archive_set_error(&a->archive, ENOMEM,
                            "Unable to allocate memory for node data.");
          return (ARCHIVE_FATAL);
        }
        code->tree[lastnode].branches[bit] = code->numentries++;
      }

      /* set to branch */
      lastnode = code->tree[lastnode].branches[bit];
    }
  }

  if (!(code->tree[lastnode].branches[0] == -1
    && code->tree[lastnode].branches[1] == -2))
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Prefix found");
    return (ARCHIVE_FATAL);
  }

  /* Set leaf value */
  code->tree[lastnode].branches[0] = value;
  code->tree[lastnode].branches[1] = value;

  return (ARCHIVE_OK);
}